

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

void display_ego_item(wchar_t col,wchar_t row,_Bool cursor,wchar_t oid)

{
  undefined7 in_register_00000011;
  
  c_prt(curs_attrs[e_info[default_join[oid].oid].everseen]
        [CONCAT71(in_register_00000011,cursor) & 0xffffffff],e_info[default_join[oid].oid].name,row,
        col);
  return;
}

Assistant:

static void display_ego_item(int col, int row, bool cursor, int oid)
{
	/* Access the object */
	struct ego_item *ego = &e_info[default_item_id(oid)];

	/* Choose a color */
	uint8_t attr = curs_attrs[0 != (int)ego->everseen][0 != (int)cursor];

	/* Display the name */
	c_prt(attr, ego->name, row, col);
}